

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void drawSceneNodeRecursive(cgltf_node *node,mat4 *viewProj,mat4 *parentMat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  uint uVar29;
  GLuint GVar30;
  cgltf_mesh *pcVar31;
  cgltf_accessor *pcVar32;
  void *pvVar33;
  cgltf_size cVar34;
  cgltf_texture *pcVar35;
  cgltf_node **ppcVar36;
  cgltf_node *node_00;
  bool bVar37;
  uint skinning;
  cgltf_size cVar38;
  PFNGLDRAWARRAYSPROC p_Var39;
  PFNGLDRAWELEMENTSPROC p_Var40;
  PFNGLUNIFORM4FVPROC p_Var41;
  GLenum GVar42;
  GLenum GVar43;
  ShaderData *pSVar44;
  GLuint *pGVar45;
  char *__function;
  mat4 *extraout_RDX;
  mat4 *extraout_RDX_00;
  mat4 *extraout_RDX_01;
  cgltf_material *pcVar46;
  GLuint GVar47;
  ulong uVar48;
  float *pfVar49;
  long lVar50;
  float *pfVar51;
  long lVar52;
  long lVar53;
  cgltf_size cVar54;
  cgltf_attribute **ppcVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  mat3 modelMat3;
  mat4 modelViewProj;
  mat4 jointMatrices [64];
  GLsizei local_1140;
  float local_10fc;
  float local_10f8;
  float local_10f4;
  float local_10f0;
  float local_10ec;
  float local_10e8;
  float local_10e4;
  float local_10e0;
  float local_10dc;
  cgltf_node *local_10d8;
  cgltf_skin *local_10d0;
  float local_10c8;
  undefined4 uStack_10c4;
  undefined4 uStack_10c0;
  undefined4 uStack_10bc;
  float local_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  float local_10a8;
  undefined4 uStack_10a4;
  undefined4 uStack_10a0;
  undefined4 uStack_109c;
  float local_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  GLfloat local_1038 [14];
  float afStack_1000 [1012];
  
  uVar48 = (ulong)((int)((ulong)((long)node - (long)parsedData->nodes) >> 3) * 0x684bda13);
  if (DAT_003fb960 <= uVar48) {
LAB_001172fb:
    __assert_fail("i < _size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/containers/vector.hpp"
                  ,0x2c,
                  "T &tl::Vector<glm::mat<4, 4, float>>::operator[](size_t) [T = glm::mat<4, 4, float>]"
                 );
  }
  pcVar31 = node->mesh;
  if (pcVar31 != (cgltf_mesh *)0x0) {
    pfVar49 = (float *)(uVar48 * 0x40 + anims::nodesMatrices);
    local_10d0 = node->skin;
    bVar37 = local_10d0 != (cgltf_skin *)0x0;
    parentMat = (mat4 *)CONCAT71((int7)((ulong)parentMat >> 8),bVar37);
    local_10d8 = node;
    if (local_10d0 == (cgltf_skin *)0x0) {
      local_1140 = 0;
    }
    else {
      local_1140 = (GLsizei)local_10d0->joints_count;
      lVar50 = local_10d0->joints_count << 0x20;
      if (lVar50 != 0) {
        fVar67 = *pfVar49;
        fVar1 = pfVar49[1];
        fVar2 = pfVar49[2];
        fVar74 = pfVar49[4];
        fVar77 = pfVar49[5];
        fVar71 = pfVar49[6];
        fVar3 = pfVar49[8];
        fVar56 = pfVar49[9];
        fVar72 = pfVar49[10];
        fVar73 = fVar77 * fVar72 - fVar71 * fVar56;
        fVar76 = fVar1 * fVar72 - fVar2 * fVar56;
        fVar78 = fVar1 * fVar71 - fVar2 * fVar77;
        fVar65 = 1.0 / (fVar3 * fVar78 + (fVar67 * fVar73 - fVar76 * fVar74));
        fVar73 = fVar73 * fVar65;
        local_10c8 = -(fVar74 * fVar72 - fVar71 * fVar3) * fVar65;
        fVar64 = (fVar74 * fVar56 - fVar77 * fVar3) * fVar65;
        fVar76 = -fVar76 * fVar65;
        fVar72 = (fVar72 * fVar67 - fVar2 * fVar3) * fVar65;
        local_10b8 = -(fVar56 * fVar67 - fVar3 * fVar1) * fVar65;
        fVar78 = fVar78 * fVar65;
        fVar71 = -(fVar71 * fVar67 - fVar2 * fVar74) * fVar65;
        fVar65 = (fVar67 * fVar77 - fVar1 * fVar74) * fVar65;
        fVar67 = pfVar49[0xc];
        fVar1 = pfVar49[0xd];
        fVar2 = pfVar49[0xe];
        uStack_10c4 = 0x80000000;
        uStack_10c0 = 0x80000000;
        uStack_10bc = 0x80000000;
        fVar74 = (-fVar73 * fVar67 - fVar1 * local_10c8) - fVar64 * fVar2;
        uStack_10b4 = 0x80000000;
        uStack_10b0 = 0x80000000;
        uStack_10ac = 0x80000000;
        fVar77 = (-fVar76 * fVar67 - fVar1 * fVar72) - local_10b8 * fVar2;
        fVar67 = (-fVar78 * fVar67 - fVar1 * fVar71) - fVar2 * fVar65;
        lVar50 = lVar50 >> 0x20;
        pfVar51 = afStack_1000;
        uVar48 = 0;
        do {
          pcVar32 = local_10d0->inverse_bind_matrices;
          if (pcVar32->count <= uVar48) {
            __assert_fail("i < a.count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/utils.hpp"
                          ,0x54,
                          "const void *cgltfAccessAccessor(const cgltf_accessor &, cgltf_size)");
          }
          lVar52 = (long)local_10d0->joints[uVar48] - (long)parsedData->nodes >> 3;
          if (DAT_003fb960 <= (ulong)(lVar52 * -0x7b425ed097b425ed)) goto LAB_001172fb;
          lVar52 = lVar52 * 0x2f684bda12f684c0;
          fVar1 = *(float *)(anims::nodesMatrices + lVar52);
          fVar2 = *(float *)(anims::nodesMatrices + 4 + lVar52);
          fVar3 = *(float *)(anims::nodesMatrices + 8 + lVar52);
          fVar56 = *(float *)(anims::nodesMatrices + 0xc + lVar52);
          fVar66 = *(float *)(anims::nodesMatrices + 0x10 + lVar52);
          fVar4 = *(float *)(anims::nodesMatrices + 0x14 + lVar52);
          fVar5 = *(float *)(anims::nodesMatrices + 0x18 + lVar52);
          fVar79 = *(float *)(anims::nodesMatrices + 0x1c + lVar52);
          fVar6 = *(float *)(anims::nodesMatrices + 0x20 + lVar52);
          fVar7 = *(float *)(anims::nodesMatrices + 0x24 + lVar52);
          fVar8 = *(float *)(anims::nodesMatrices + 0x28 + lVar52);
          fVar62 = *(float *)(anims::nodesMatrices + 0x2c + lVar52);
          local_1098 = fVar74 * fVar56 + fVar64 * fVar3 + local_10c8 * fVar2 + fVar73 * fVar1;
          uStack_1094 = 0x80000000;
          uStack_1090 = 0x80000000;
          uStack_108c = 0x80000000;
          fVar68 = fVar77 * fVar56 + local_10b8 * fVar3 + fVar72 * fVar2 + fVar76 * fVar1;
          fVar69 = fVar67 * fVar56 + fVar65 * fVar3 + fVar71 * fVar2 + fVar78 * fVar1;
          fVar56 = fVar3 * 0.0 + fVar2 * 0.0 + fVar1 * 0.0 + fVar56;
          fVar57 = fVar74 * fVar79 + fVar64 * fVar5 + local_10c8 * fVar4 + fVar73 * fVar66;
          fVar58 = fVar77 * fVar79 + local_10b8 * fVar5 + fVar72 * fVar4 + fVar76 * fVar66;
          fVar59 = fVar67 * fVar79 + fVar65 * fVar5 + fVar71 * fVar4 + fVar78 * fVar66;
          fVar79 = fVar5 * 0.0 + fVar4 * 0.0 + fVar66 * 0.0 + fVar79;
          fVar1 = *(float *)(anims::nodesMatrices + 0x30 + lVar52);
          fVar2 = *(float *)(anims::nodesMatrices + 0x34 + lVar52);
          fVar60 = fVar74 * fVar62 + fVar64 * fVar8 + local_10c8 * fVar7 + fVar73 * fVar6;
          fVar61 = fVar77 * fVar62 + local_10b8 * fVar8 + fVar72 * fVar7 + fVar76 * fVar6;
          local_10a8 = fVar67 * fVar62 + fVar65 * fVar8 + fVar71 * fVar7 + fVar78 * fVar6;
          uStack_10a4 = 0x80000000;
          uStack_10a0 = 0x80000000;
          uStack_109c = 0x80000000;
          fVar62 = fVar8 * 0.0 + fVar7 * 0.0 + fVar6 * 0.0 + fVar62;
          fVar3 = *(float *)(anims::nodesMatrices + 0x38 + lVar52);
          fVar66 = *(float *)(anims::nodesMatrices + 0x3c + lVar52);
          fVar70 = fVar74 * fVar66 + fVar64 * fVar3 + local_10c8 * fVar2 + fVar73 * fVar1;
          fVar63 = fVar77 * fVar66 + local_10b8 * fVar3 + fVar72 * fVar2 + fVar76 * fVar1;
          fVar75 = fVar67 * fVar66 + fVar65 * fVar3 + fVar71 * fVar2 + fVar78 * fVar1;
          pvVar33 = pcVar32->buffer_view->buffer->data;
          fVar66 = fVar3 * 0.0 + fVar2 * 0.0 + fVar1 * 0.0 + fVar66;
          lVar52 = pcVar32->offset + pcVar32->buffer_view->offset;
          lVar53 = pcVar32->stride * uVar48;
          fVar1 = *(float *)((long)pvVar33 + lVar53 + lVar52);
          fVar2 = *(float *)((long)pvVar33 + lVar53 + 4 + lVar52);
          fVar3 = *(float *)((long)pvVar33 + lVar53 + 8 + lVar52);
          fVar4 = *(float *)((long)pvVar33 + lVar53 + 0xc + lVar52);
          local_1088 = fVar70 * fVar4 + fVar60 * fVar3 + fVar57 * fVar2 + local_1098 * fVar1;
          fStack_1084 = fVar63 * fVar4 + fVar61 * fVar3 + fVar58 * fVar2 + fVar68 * fVar1;
          fStack_1080 = fVar75 * fVar4 + local_10a8 * fVar3 + fVar59 * fVar2 + fVar69 * fVar1;
          fStack_107c = fVar4 * fVar66 + fVar3 * fVar62 + fVar2 * fVar79 + fVar1 * fVar56;
          fVar1 = *(float *)((long)pvVar33 + lVar53 + 0x10 + lVar52);
          fVar2 = *(float *)((long)pvVar33 + lVar53 + 0x14 + lVar52);
          fVar3 = *(float *)((long)pvVar33 + lVar53 + 0x18 + lVar52);
          fVar4 = *(float *)((long)pvVar33 + lVar53 + 0x1c + lVar52);
          fVar5 = *(float *)((long)pvVar33 + lVar53 + 0x20 + lVar52);
          fVar6 = *(float *)((long)pvVar33 + lVar53 + 0x24 + lVar52);
          fVar7 = *(float *)((long)pvVar33 + lVar53 + 0x28 + lVar52);
          fVar8 = *(float *)((long)pvVar33 + lVar53 + 0x2c + lVar52);
          fVar9 = *(float *)((long)pvVar33 + lVar53 + 0x30 + lVar52);
          fVar10 = *(float *)((long)pvVar33 + lVar53 + 0x34 + lVar52);
          fVar11 = *(float *)((long)pvVar33 + lVar53 + 0x38 + lVar52);
          fVar12 = *(float *)((long)pvVar33 + lVar53 + 0x3c + lVar52);
          *(ulong *)(pfVar51 + -0xe) = CONCAT44(fStack_1084,local_1088);
          *(ulong *)(pfVar51 + -0xc) = CONCAT44(fStack_107c,fStack_1080);
          pfVar51[-10] = fVar70 * fVar4 + fVar60 * fVar3 + fVar57 * fVar2 + local_1098 * fVar1;
          pfVar51[-9] = fVar63 * fVar4 + fVar61 * fVar3 + fVar58 * fVar2 + fVar68 * fVar1;
          pfVar51[-8] = fVar75 * fVar4 + local_10a8 * fVar3 + fVar59 * fVar2 + fVar69 * fVar1;
          pfVar51[-7] = fVar4 * fVar66 + fVar3 * fVar62 + fVar2 * fVar79 + fVar1 * fVar56;
          pfVar51[-6] = fVar70 * fVar8 + fVar60 * fVar7 + fVar57 * fVar6 + local_1098 * fVar5;
          pfVar51[-5] = fVar63 * fVar8 + fVar61 * fVar7 + fVar58 * fVar6 + fVar68 * fVar5;
          pfVar51[-4] = fVar75 * fVar8 + local_10a8 * fVar7 + fVar59 * fVar6 + fVar69 * fVar5;
          pfVar51[-3] = fVar8 * fVar66 + fVar7 * fVar62 + fVar6 * fVar79 + fVar5 * fVar56;
          pfVar51[-2] = fVar70 * fVar12 + fVar60 * fVar11 + fVar57 * fVar10 + local_1098 * fVar9;
          pfVar51[-1] = fVar63 * fVar12 + fVar61 * fVar11 + fVar58 * fVar10 + fVar68 * fVar9;
          *pfVar51 = fVar75 * fVar12 + local_10a8 * fVar11 + fVar59 * fVar10 + fVar69 * fVar9;
          pfVar51[1] = fVar66 * fVar12 + fVar62 * fVar11 + fVar79 * fVar10 + fVar56 * fVar9;
          uVar48 = uVar48 + 1;
          pfVar51 = pfVar51 + 0x10;
        } while (lVar50 + (ulong)(lVar50 == 0) != uVar48);
      }
    }
    local_10fc = *pfVar49;
    local_10f8 = pfVar49[1];
    local_10f4 = pfVar49[2];
    local_10f0 = pfVar49[4];
    local_10ec = pfVar49[5];
    local_10e8 = pfVar49[6];
    local_10e4 = pfVar49[8];
    local_10e0 = pfVar49[9];
    local_10dc = pfVar49[10];
    uVar13 = viewProj->value[0].field_0;
    uVar21 = viewProj->value[0].field_1;
    uVar14 = viewProj->value[0].field_2;
    uVar22 = viewProj->value[0].field_3;
    uVar15 = viewProj->value[1].field_0;
    uVar23 = viewProj->value[1].field_1;
    uVar16 = viewProj->value[1].field_2;
    uVar24 = viewProj->value[1].field_3;
    uVar17 = viewProj->value[2].field_0;
    uVar25 = viewProj->value[2].field_1;
    fVar67 = *pfVar49;
    fVar1 = pfVar49[1];
    fVar2 = pfVar49[2];
    uVar18 = viewProj->value[2].field_2;
    uVar26 = viewProj->value[2].field_3;
    uVar19 = viewProj->value[3].field_0;
    uVar27 = viewProj->value[3].field_1;
    fVar74 = pfVar49[3];
    local_1078 = (float)uVar19 * fVar74 +
                 (float)uVar17 * fVar2 + (float)uVar15 * fVar1 + (float)uVar13 * fVar67;
    fStack_1074 = (float)uVar27 * fVar74 +
                  (float)uVar25 * fVar2 + (float)uVar23 * fVar1 + (float)uVar21 * fVar67;
    uVar20 = viewProj->value[3].field_2;
    uVar28 = viewProj->value[3].field_3;
    fStack_1070 = (float)uVar20 * fVar74 +
                  (float)uVar18 * fVar2 + (float)uVar16 * fVar1 + (float)uVar14 * fVar67;
    fStack_106c = fVar74 * (float)uVar28 +
                  fVar2 * (float)uVar26 + fVar1 * (float)uVar24 + fVar67 * (float)uVar22;
    fVar67 = pfVar49[4];
    fVar1 = pfVar49[5];
    fVar2 = pfVar49[6];
    fVar74 = pfVar49[7];
    fVar77 = pfVar49[8];
    fVar71 = pfVar49[9];
    fVar3 = pfVar49[10];
    fVar56 = pfVar49[0xb];
    fVar72 = pfVar49[0xc];
    fVar64 = pfVar49[0xd];
    fVar65 = pfVar49[0xe];
    fVar73 = pfVar49[0xf];
    local_1068 = (float)uVar19 * fVar74 +
                 (float)uVar17 * fVar2 + (float)uVar15 * fVar1 + (float)uVar13 * fVar67;
    fStack_1064 = (float)uVar27 * fVar74 +
                  (float)uVar25 * fVar2 + (float)uVar23 * fVar1 + (float)uVar21 * fVar67;
    fStack_1060 = (float)uVar20 * fVar74 +
                  (float)uVar18 * fVar2 + (float)uVar16 * fVar1 + (float)uVar14 * fVar67;
    fStack_105c = fVar74 * (float)uVar28 +
                  fVar2 * (float)uVar26 + fVar1 * (float)uVar24 + fVar67 * (float)uVar22;
    local_1058 = (float)uVar19 * fVar56 +
                 (float)uVar17 * fVar3 + (float)uVar15 * fVar71 + (float)uVar13 * fVar77;
    fStack_1054 = (float)uVar27 * fVar56 +
                  (float)uVar25 * fVar3 + (float)uVar23 * fVar71 + (float)uVar21 * fVar77;
    fStack_1050 = (float)uVar20 * fVar56 +
                  (float)uVar18 * fVar3 + (float)uVar16 * fVar71 + (float)uVar14 * fVar77;
    fStack_104c = fVar56 * (float)uVar28 +
                  fVar3 * (float)uVar26 + fVar71 * (float)uVar24 + fVar77 * (float)uVar22;
    local_1048 = (float)uVar19 * fVar73 +
                 (float)uVar17 * fVar65 + (float)uVar15 * fVar64 + (float)uVar13 * fVar72;
    fStack_1044 = (float)uVar27 * fVar73 +
                  (float)uVar25 * fVar65 + (float)uVar23 * fVar64 + (float)uVar21 * fVar72;
    fStack_1040 = (float)uVar20 * fVar73 +
                  (float)uVar18 * fVar65 + (float)uVar16 * fVar64 + (float)uVar14 * fVar72;
    fStack_103c = (float)uVar28 * fVar73 +
                  (float)uVar26 * fVar65 + (float)uVar24 * fVar64 + (float)uVar22 * fVar72;
    lVar50 = (long)pcVar31 - (long)parsedData->meshes >> 3;
    if ((ulong)gpu::meshPrimsVaos._4096_8_ <= (ulong)(lVar50 * -0x71c71c71c71c71c7)) {
      __function = 
      "T &tl::FVector<unsigned int, 1024>::operator[](size_t) [T = unsigned int, N = 1024]";
LAB_001172d2:
      __assert_fail("i < _size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/containers/fvector.hpp"
                    ,0x42,__function);
    }
    cVar34 = pcVar31->primitives_count;
    if (cVar34 != 0) {
      skinning = (uint)bVar37;
      uVar29 = *(uint *)(gpu::meshPrimsVaos + lVar50 * 0x38e38e38e38e38e4);
      ppcVar55 = &pcVar31->primitives->attributes;
      cVar54 = 0;
      do {
        pcVar46 = (cgltf_material *)ppcVar55[-1];
        if (pcVar46 == (cgltf_material *)0x0) {
          pcVar46 = &s_defaultMaterial;
        }
        if (pcVar46->has_pbr_metallic_roughness == 0) {
          __assert_fail("false && \"type of material not supported\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                        ,0x37a,
                        "void drawSceneNodeRecursive(const cgltf_node &, const glm::mat4 &, const glm::mat4 &)"
                       );
        }
        GVar30 = *(GLuint *)(gpu::vaos + cVar54 * 4 + (ulong)uVar29 * 4);
        pSVar44 = gpu::shaderPbrMetallic(skinning);
        (*glad_debug_glUseProgram)(pSVar44->prog);
        (*glad_debug_glUniformMatrix4fv)((pSVar44->unifLocs).modelViewProj,1,'\0',&local_1078);
        (*glad_debug_glUniformMatrix3fv)((pSVar44->unifLocs).modelMat3,1,'\0',&local_10fc);
        if (local_10d0 != (cgltf_skin *)0x0) {
          (*glad_debug_glUniformMatrix4fv)
                    ((pSVar44->unifLocs).jointMatrices,local_1140,'\0',local_1038);
        }
        (*glad_debug_glActiveTexture)(0x84c0);
        p_Var41 = glad_debug_glUniform4fv;
        if (pcVar46->has_pbr_metallic_roughness != 0) {
          pSVar44 = gpu::shaderPbrMetallic(skinning);
          (*p_Var41)((pSVar44->unifLocs).color,1,(pcVar46->pbr_metallic_roughness).base_color_factor
                    );
          pcVar35 = (pcVar46->pbr_metallic_roughness).base_color_texture.texture;
          pGVar45 = &gpu::whiteTexture;
          if (pcVar35 == (cgltf_texture *)0x0) {
LAB_0011714b:
            (*glad_debug_glBindTexture)(0xde1,*pGVar45);
            goto LAB_00117167;
          }
          lVar50 = (long)pcVar35 - (long)parsedData->textures >> 3;
          if ((ulong)(lVar50 * -0x3333333333333333) < DAT_003fb938) {
            pGVar45 = &gpu::textures + lVar50 * 0xccccccccccccccd;
            goto LAB_0011714b;
          }
LAB_001172bd:
          __function = 
          "T &tl::FVector<unsigned int, 128>::operator[](size_t) [T = unsigned int, N = 128]";
          goto LAB_001172d2;
        }
        if (pcVar46->has_pbr_specular_glossiness != 0) {
          __assert_fail("\"todo\" && false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                        ,0x354,
                        "auto drawSceneNodeRecursive(const cgltf_node &, const glm::mat4 &, const glm::mat4 &)::(anonymous class)::operator()() const"
                       );
        }
LAB_00117167:
        (*glad_debug_glActiveTexture)(0x84c1);
        pcVar35 = (pcVar46->normal_texture).texture;
        if (pcVar35 == (cgltf_texture *)0x0) {
          GVar47 = 0;
        }
        else {
          lVar50 = (long)pcVar35 - (long)parsedData->textures >> 3;
          if (DAT_003fb938 <= (ulong)(lVar50 * -0x3333333333333333)) goto LAB_001172bd;
          GVar47 = (&gpu::textures)[lVar50 * 0xccccccccccccccd];
        }
        (*glad_debug_glBindTexture)(0xde1,GVar47);
        (*glad_debug_glBindVertexArray)(GVar30);
        p_Var40 = glad_debug_glDrawElements;
        p_Var39 = glad_debug_glDrawArrays;
        if ((cgltf_accessor *)ppcVar55[-2] == (cgltf_accessor *)0x0) {
          GVar42 = cgltfPrimTypeToGl(((cgltf_primitive *)(ppcVar55 + -3))->type);
          (*p_Var39)(GVar42,0,(GLsizei)(*ppcVar55)->data->count);
          parentMat = extraout_RDX_00;
        }
        else {
          GVar42 = cgltfPrimTypeToGl(((cgltf_primitive *)(ppcVar55 + -3))->type);
          cVar38 = ((cgltf_accessor *)ppcVar55[-2])->count;
          GVar43 = cgltfComponentTypeToGl(((cgltf_accessor *)ppcVar55[-2])->component_type);
          (*p_Var40)(GVar42,(GLsizei)cVar38,GVar43,
                     (void *)(((cgltf_accessor *)ppcVar55[-2])->offset +
                             ((cgltf_accessor *)ppcVar55[-2])->buffer_view->offset));
          parentMat = extraout_RDX;
        }
        cVar54 = cVar54 + 1;
        ppcVar55 = ppcVar55 + 9;
        node = local_10d8;
      } while (cVar34 != cVar54);
    }
  }
  cVar34 = node->children_count;
  if (cVar34 != 0) {
    ppcVar36 = node->children;
    lVar50 = 0;
    do {
      node_00 = *(cgltf_node **)((long)ppcVar36 + lVar50);
      if (node_00 == (cgltf_node *)0x0) {
        __assert_fail("child",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                      ,0x381,
                      "void drawSceneNodeRecursive(const cgltf_node &, const glm::mat4 &, const glm::mat4 &)"
                     );
      }
      drawSceneNodeRecursive(node_00,viewProj,parentMat);
      lVar50 = lVar50 + 8;
      parentMat = extraout_RDX_01;
    } while (cVar34 << 3 != lVar50);
  }
  return;
}

Assistant:

static void drawSceneNodeRecursive(const cgltf_node& node, const glm::mat4& viewProj,
    const glm::mat4& parentMat = glm::mat4(1.0))
{
    const i32 nodeInd = getNodeInd(&node);
    const glm::mat4& modelMat = anims::nodesMatrices[nodeInd];

    if(node.mesh)
    {
        const int skinning = node.skin ? 1 : 0;
        int numJoints = 0;
        glm::mat4 jointMatrices[MAX_NUM_JOINTS];
        if(node.skin) {
            numJoints = node.skin->joints_count;
            const glm::mat4 modelMatInv = glm::affineInverse(modelMat);
            for(size_t i = 0; i < numJoints; i++) {
                const cgltf_node& joint = *node.skin->joints[i];
                const size_t jointNodeInd = getNodeInd(&joint);
                const glm::mat4& invBindMtx = *(const glm::mat4*)cgltfAccessAccessor(*node.skin->inverse_bind_matrices, i);
                jointMatrices[i] =
                    modelMatInv *
                    anims::nodesMatrices[jointNodeInd] *
                    invBindMtx;
            }
        }

        const glm::mat3 modelMat3 = modelMat;
        const glm::mat4 modelViewProj = viewProj * modelMat;
        CSpan<cgltf_primitive> primitives(node.mesh->primitives, node.mesh->primitives_count);
        const u32* vaos = gpu::vaos.begin() + gpu::meshPrimsVaos[getMeshInd(node.mesh)];
        for(size_t i = 0; i < primitives.size(); i++)
        {
            const cgltf_primitive& prim = primitives[i];
            const u32 vao = vaos[i];
            const auto& material = prim.material ? *prim.material : s_defaultMaterial;

            auto draw = [&]
            {
                glActiveTexture(GL_TEXTURE0 + (u32)ETexUnit::ALBEDO);
                if(material.has_pbr_metallic_roughness) {
                    glUniform4fv(gpu::shaderPbrMetallic(skinning).unifLocs.color,
                                 1, material.pbr_metallic_roughness.base_color_factor);
                    if(auto tex = material.pbr_metallic_roughness.base_color_texture.texture)
                        glBindTexture(GL_TEXTURE_2D, gpu::textures[getTextureInd(tex)]);
                    else
                        glBindTexture(GL_TEXTURE_2D, gpu::whiteTexture);
                }
                else if(material.has_pbr_specular_glossiness) {
                    assert("todo" && false);
                }

                glActiveTexture(GL_TEXTURE0 + (u32)ETexUnit::NORMAL);
                if(auto tex = material.normal_texture.texture)
                    glBindTexture(GL_TEXTURE_2D, gpu::textures[getTextureInd(tex)]);
                else
                    glBindTexture(GL_TEXTURE_2D, gpu::blueTexture);

                glBindVertexArray(vao);
                if(prim.indices) {
                    glDrawElements(
                       cgltfPrimTypeToGl(prim.type),
                       prim.indices->count,
                       cgltfComponentTypeToGl(prim.indices->component_type),
                       (void*)(prim.indices->buffer_view->offset + prim.indices->offset)
                    );
                }
                else {
                    glDrawArrays(cgltfPrimTypeToGl(prim.type), 0, prim.attributes->data->count);
                }
            };
            auto uploadCommonUniforms = [&](const ShaderData& shader)
            {
                glUniformMatrix4fv(shader.unifLocs.modelViewProj, 1, GL_FALSE, &modelViewProj[0][0]);
                glUniformMatrix3fv(shader.unifLocs.modelMat3, 1, GL_FALSE, &modelMat3[0][0]);
                if(skinning)
                    glUniformMatrix4fv(shader.unifLocs.jointMatrices, numJoints, GL_FALSE, &jointMatrices[0][0][0]);
            };

            if(material.has_pbr_metallic_roughness)
            {
                auto& shader = gpu::shaderPbrMetallic(skinning);
                glUseProgram(shader.prog);
                uploadCommonUniforms(shader);
                draw();
            }
            else {
                assert(false && "type of material not supported");
            }
        }
    }

    CSpan<cgltf_node*> children(node.children, node.children_count);
    for(cgltf_node* child : children) {
        assert(child);
        drawSceneNodeRecursive(*child, viewProj, modelMat);
    }
}